

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O2

void invert_U8(uchar *U,int n)

{
  byte bVar1;
  uint uVar2;
  char cVar3;
  long lVar4;
  int k;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  for (uVar7 = (ulong)(n + -2); uVar6 = (uint)uVar7, -1 < (int)uVar6; uVar7 = uVar7 - 1) {
    iVar9 = (n / 8) * uVar6;
    uVar2 = uVar6 + 1 >> 3;
    cVar3 = (char)(0x100 >> ((byte)(uVar6 + 1) & 7));
    uVar8 = uVar7;
    while (0 < (long)uVar8) {
      uVar8 = uVar8 - 1;
      bVar1 = -((U[(int)(((int)uVar8 * n) / 8 + ((uint)(uVar7 >> 3) & 0x1fffffff))] >> (~uVar6 & 7)
                & 1) != 0);
      lVar4 = uVar8 * (long)(n / 8);
      for (uVar5 = n - 1; (int)(uVar6 + 9) <= (int)uVar5; uVar5 = uVar5 - 8) {
        U[(ulong)(uVar5 >> 3) + lVar4] =
             U[(ulong)(uVar5 >> 3) + lVar4] ^ U[(int)((uVar5 >> 3) + iVar9)] & bVar1;
      }
      U[lVar4 + (ulong)uVar2] =
           (bVar1 & U[(int)(uVar2 + iVar9)] ^ U[lVar4 + (ulong)uVar2]) & cVar3 - 1U |
           U[lVar4 + (ulong)uVar2] & -cVar3;
    }
  }
  return;
}

Assistant:

void invert_U8(unsigned char *U, int n)
{
  /*
   * inversion == backwards substitution
   *
   * For all columns c = n-1 ... 0
   *   For all rows c-1 ... 0
   *     add (row c) * (leading (c'th) element of row r) to row r.
   *       only do it for the k elements k = c+1 ... n-1
   */
  for(int c = n-2; c >= 0; c--)
  {
    /*
     * Basically:
     *      copy elements c+1 to n-1 from c'th row to r'th row iff leading element of row r is 1
     */

    for(int r = c-1; r >= 0; r--)
    {
      /*
       * first copy all "full bytes" at the right
       */
      unsigned char mask_rc = 0x00 - ((U[r*n/8 + (c/8)] >> (7 - (c % 8))) & 1); // mask for the element U(r,c)
      for(int k = n-1; k >= c+1 + 8; k -= 8)
      {
        U[r*(n/8) + k/8] ^= mask_rc & U[c*(n/8) + k/8];
      }

      /*
       * then handle the left-most "partial byte"
       */
      int k = c+1;
      unsigned char mask_prepending = (unsigned char) (0x100 >> (k % 8)) - 1;

      unsigned char tmp_rk = U[r*(n/8) + k/8] & ~mask_prepending; // store the left side of the splitted byte in tmp
      U[r*(n/8) + k/8]  ^= (mask_rc & U[c*(n/8) + k/8]);

      // restore the left bits: first set bits 0, then 'or' tmp
      U[r*(n/8) + k/8] &= mask_prepending;
      U[r*(n/8) + k/8] |= tmp_rk;
    }
  }
}